

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> *
__thiscall
pstore::command_line::
parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
operator()(maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
           *__return_storage_ptr__,
          parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          *this,string *v)

{
  literal *plVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  __it;
  __normal_iterator<const_pstore::command_line::literal_*,_std::vector<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>_>
  _Var6;
  pointer plVar7;
  
  __it._M_current =
       (this->super_parser_base).literals_.
       super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
       ._M_impl.super__Vector_impl_data._M_start;
  plVar1 = (this->super_parser_base).literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)plVar1 - (long)__it._M_current;
  if (lVar4 == 0) {
LAB_00113c33:
    __return_storage_ptr__->valid_ = true;
    (__return_storage_ptr__->storage_).__align =
         (anon_struct_8_0_00000001_for___align)((long)&__return_storage_ptr__->storage_ + 0x10);
    pcVar2 = (v->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->storage_,pcVar2,pcVar2 + v->_M_string_length);
  }
  else {
    lVar5 = (lVar4 >> 3) * -0x71c71c71c71c71c7 >> 2;
    if (0 < lVar5) {
      plVar7 = __it._M_current + lVar5 * 4;
      lVar5 = lVar5 + 1;
      do {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it);
        _Var6._M_current = __it._M_current;
        if (bVar3) goto LAB_00113c2e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it._M_current + 1);
        _Var6._M_current = __it._M_current + 1;
        if (bVar3) goto LAB_00113c2e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it._M_current + 2);
        _Var6._M_current = __it._M_current + 2;
        if (bVar3) goto LAB_00113c2e;
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it._M_current + 3);
        _Var6._M_current = __it._M_current + 3;
        if (bVar3) goto LAB_00113c2e;
        __it._M_current = __it._M_current + 4;
        lVar5 = lVar5 + -1;
      } while (1 < lVar5);
      lVar4 = (long)plVar1 - (long)plVar7;
      __it._M_current = plVar7;
    }
    lVar4 = (lVar4 >> 3) * -0x71c71c71c71c71c7;
    if (lVar4 == 1) {
LAB_00113c1a:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
              ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                            *)v,__it);
      _Var6._M_current = __it._M_current;
      if (!bVar3) {
        _Var6._M_current = plVar1;
      }
LAB_00113c2e:
      if (_Var6._M_current != plVar1) goto LAB_00113c33;
    }
    else {
      if (lVar4 == 2) {
LAB_00113c02:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it);
        _Var6._M_current = __it._M_current;
        if (!bVar3) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00113c1a;
        }
        goto LAB_00113c2e;
      }
      if (lVar4 == 3) {
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::$_0>
                ::operator()((_Iter_pred<pstore::command_line::parser<std::__cxx11::string,void>::operator()(std::__cxx11::string_const&)const::__0>
                              *)v,__it);
        _Var6._M_current = __it._M_current;
        if (!bVar3) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00113c02;
        }
        goto LAB_00113c2e;
      }
    }
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x10) = 0;
    *(undefined8 *)__return_storage_ptr__ = 0;
    (__return_storage_ptr__->storage_).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->storage_ + 0x18) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<std::string> parser<std::string>::operator() (std::string const & v) const {
                // If this one of the literal strings?
                auto const begin = this->begin ();
                auto const end = this->end ();
                if (std::distance (begin, end) != 0) {
                    auto const pos = std::find_if (
                        begin, end, [&v] (literal const & lit) { return v == lit.name; });
                    if (pos == end) {
                        return nothing<std::string> ();
                    }
                }
                return just (v);
            }